

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O3

void __thiscall DirectionCone_UnionRandoms_Test::TestBody(DirectionCone_UnionRandoms_Test *this)

{
  byte bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  uint64_t uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t uVar7;
  char *in_R9;
  int iVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  float fVar22;
  undefined1 auVar23 [12];
  AssertionResult gtest_ar_;
  DirectionCone c;
  DirectionCone b;
  DirectionCone a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  string local_110;
  RNG local_f0;
  float local_dc;
  internal local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  DirectionCone local_c4;
  DirectionCone local_b0;
  DirectionCone local_9c;
  ulong local_88;
  AssertHelper local_80;
  Tuple3<pbrt::Vector3,_float> local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_f0.inc = 0x21;
  local_f0.state = 0xff54477fb4c4008b;
  local_88 = 0;
  do {
    RandomCone(&local_9c,&local_f0);
    RandomCone(&local_b0,&local_f0);
    pbrt::Union(&local_c4,&local_9c,&local_b0);
    uVar3 = local_f0.inc;
    iVar8 = 100;
    uVar7 = local_f0.state;
    do {
      uVar6 = uVar7 * 0x5851f42d4c957f2d + uVar3;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar7;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar6;
      auVar12 = vpunpcklqdq_avx(auVar14,auVar11);
      auVar10 = vpsrlvq_avx2(auVar12,_DAT_0054e5c0);
      auVar11 = vpsrlvq_avx2(auVar12,_DAT_0054e5b0);
      auVar12 = vpsrlq_avx(auVar12,0x3b);
      auVar12 = vpshufd_avx(auVar12,0xe8);
      uVar7 = uVar6 * 0x5851f42d4c957f2d + uVar3;
      auVar10 = vpshufd_avx(auVar11 ^ auVar10,0xe8);
      auVar12 = vprorvd_avx512vl(auVar10,auVar12);
      auVar10 = vcvtudq2ps_avx512vl(auVar12);
      auVar12._8_4_ = 0x2f800000;
      auVar12._0_8_ = 0x2f8000002f800000;
      auVar12._12_4_ = 0x2f800000;
      auVar11 = vmulps_avx512vl(auVar10,auVar12);
      auVar10._8_4_ = 0x3f7fffff;
      auVar10._0_8_ = 0x3f7fffff3f7fffff;
      auVar10._12_4_ = 0x3f7fffff;
      uVar6 = vcmpps_avx512vl(auVar11,auVar10,1);
      auVar12 = vmovshdup_avx(auVar11);
      bVar1 = (byte)(uVar6 >> 1);
      local_48 = vfmadd132ss_fma(ZEXT416((uint)(bVar1 & 1) * auVar12._0_4_ +
                                         (uint)!(bool)(bVar1 & 1) * 0x3f7fffff),
                                 SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
      auVar12 = vfnmadd213ss_fma(local_48,local_48,SUB6416(ZEXT464(0x3f800000),0));
      auVar12 = vmaxss_avx(auVar12,ZEXT416(0));
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      local_dc = auVar12._0_4_;
      fVar9 = (float)((uint)((byte)uVar6 & 1) * (int)(auVar11._0_4_ * 6.2831855) +
                     (uint)!(bool)((byte)uVar6 & 1) * 0x40c90fda);
      local_58 = ZEXT416((uint)fVar9);
      fVar9 = cosf(fVar9);
      local_68 = ZEXT416((uint)(fVar9 * local_dc));
      fVar9 = sinf((float)local_58._0_4_);
      fVar9 = fVar9 * local_dc;
      auVar12 = vinsertps_avx(local_68,ZEXT416((uint)fVar9),0x10);
      local_78._0_8_ = vmovlps_avx(auVar12);
      local_78.z = local_48._0_4_;
      fVar22 = local_68._0_4_;
      auVar23 = local_68._4_12_;
      auVar21 = local_48._4_12_;
      if (local_9c.empty == false) {
        auVar12 = ZEXT416((uint)(local_78.z * local_78.z + fVar22 * fVar22 + fVar9 * fVar9));
        auVar12 = vsqrtss_avx(auVar12,auVar12);
        fVar13 = auVar12._0_4_;
        auVar18._0_4_ = fVar22 / fVar13;
        auVar18._4_12_ = auVar23;
        auVar15._0_4_ = local_78.z / fVar13;
        auVar15._4_12_ = auVar21;
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)((fVar9 / fVar13) *
                                                local_9c.w.super_Tuple3<pbrt::Vector3,_float>.y)),
                                  auVar18,ZEXT416((uint)local_9c.w.
                                                        super_Tuple3<pbrt::Vector3,_float>.x));
        auVar12 = vfmadd231ss_fma(auVar12,auVar15,
                                  ZEXT416((uint)local_9c.w.super_Tuple3<pbrt::Vector3,_float>.z));
        if (auVar12._0_4_ < local_9c.cosTheta) goto LAB_003042a4;
LAB_003042f3:
        if (local_c4.empty == true) {
          local_d8[0] = (internal)0x0;
LAB_0030435c:
          local_d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_118);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_118.ptr_ + 0x10),"a: ",3);
          sVar2.ptr_ = local_118.ptr_;
          pbrt::DirectionCone::ToString_abi_cxx11_(&local_110,&local_9c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(sVar2.ptr_ + 0x10),local_110._M_dataplus._M_p,
                     local_110._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_118.ptr_ + 0x10),", b: ",5);
          sVar2.ptr_ = local_118.ptr_;
          pbrt::DirectionCone::ToString_abi_cxx11_(&local_110,&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(sVar2.ptr_ + 0x10),local_110._M_dataplus._M_p,
                     local_110._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_118.ptr_ + 0x10),", union: ",9);
          sVar2.ptr_ = local_118.ptr_;
          pbrt::DirectionCone::ToString_abi_cxx11_(&local_110,&local_c4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(sVar2.ptr_ + 0x10),local_110._M_dataplus._M_p,
                     local_110._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_118.ptr_ + 0x10),", w: ",5);
          pbrt::operator<<((ostream *)(local_118.ptr_ + 0x10),(Vector3<float> *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_110,local_d8,(AssertionResult *)"Inside(c, w)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                     ,0x182,local_110._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_118);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if (local_118.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_118.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_118.ptr_ + 8))();
            }
          }
        }
        else {
          auVar12 = ZEXT416((uint)(local_78.z * local_78.z + fVar22 * fVar22 + fVar9 * fVar9));
          auVar12 = vsqrtss_avx(auVar12,auVar12);
          fVar13 = auVar12._0_4_;
          auVar20._0_4_ = fVar22 / fVar13;
          auVar20._4_12_ = auVar23;
          auVar17._0_4_ = local_78.z / fVar13;
          auVar17._4_12_ = auVar21;
          auVar12 = vfmadd231ss_fma(ZEXT416((uint)((fVar9 / fVar13) *
                                                  local_c4.w.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    auVar20,ZEXT416((uint)local_c4.w.
                                                          super_Tuple3<pbrt::Vector3,_float>.x));
          auVar12 = vfmadd231ss_fma(auVar12,auVar17,
                                    ZEXT416((uint)local_c4.w.super_Tuple3<pbrt::Vector3,_float>.z));
          local_d8[0] = (internal)(local_c4.cosTheta <= auVar12._0_4_);
          local_d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!(bool)local_d8[0]) goto LAB_0030435c;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
LAB_003042a4:
        if (local_b0.empty == false) {
          auVar12 = ZEXT416((uint)(local_78.z * local_78.z + fVar22 * fVar22 + fVar9 * fVar9));
          auVar12 = vsqrtss_avx(auVar12,auVar12);
          fVar13 = auVar12._0_4_;
          auVar19._0_4_ = fVar22 / fVar13;
          auVar19._4_12_ = auVar23;
          auVar16._0_4_ = local_78.z / fVar13;
          auVar16._4_12_ = auVar21;
          auVar12 = vfmadd231ss_fma(ZEXT416((uint)((fVar9 / fVar13) *
                                                  local_b0.w.super_Tuple3<pbrt::Vector3,_float>.y)),
                                    auVar19,ZEXT416((uint)local_b0.w.
                                                          super_Tuple3<pbrt::Vector3,_float>.x));
          auVar12 = vfmadd231ss_fma(auVar12,auVar16,
                                    ZEXT416((uint)local_b0.w.super_Tuple3<pbrt::Vector3,_float>.z));
          if (local_b0.cosTheta <= auVar12._0_4_) goto LAB_003042f3;
        }
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    uVar5 = (int)local_88 + 1;
    local_88 = (ulong)uVar5;
    local_f0.state = uVar7;
    if (uVar5 == 100) {
      return;
    }
  } while( true );
}

Assistant:

TEST(DirectionCone, UnionRandoms) {
    RNG rng(16);

    for (int i = 0; i < 100; ++i) {
        DirectionCone a = RandomCone(rng), b = RandomCone(rng);
        DirectionCone c = Union(a, b);

        for (int j = 0; j < 100; ++j) {
            Vector3f w =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            if (Inside(a, w) || Inside(b, w))
                EXPECT_TRUE(Inside(c, w))
                    << "a: " << a << ", b: " << b << ", union: " << c << ", w: " << w;
        }
    }
}